

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinDecodeUTF8
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  undefined4 uVar1;
  Frame *pFVar2;
  const_reference pvVar3;
  AST *pAVar4;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_RDI;
  Frame *f;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000230;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000238;
  string *in_stack_00000240;
  LocationRange *in_stack_00000248;
  Interpreter *in_stack_00000250;
  Interpreter *in_stack_00000378;
  allocator_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff84;
  Type TVar5;
  char *in_stack_ffffffffffffff88;
  iterator pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  size_type sVar7;
  allocator<char> local_39;
  string local_38 [32];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  TVar5 = ARRAY;
  pTVar6 = (iterator)&stack0xffffffffffffff84;
  sVar7 = 1;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2dc21a);
  __l._M_len = sVar7;
  __l._M_array = pTVar6;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)CONCAT44(TVar5,in_stack_ffffffffffffff80),__l,in_stack_ffffffffffffff78);
  validateBuiltinArgs(in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238,
                      in_stack_00000230);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_RDI);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2dc26c);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pFVar2 = Stack::top((Stack *)0x2dc291);
  pFVar2->kind = FRAME_BUILTIN_DECODE_UTF8;
  pvVar3 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  uVar1 = *(undefined4 *)&pvVar3->field_0x4;
  (pFVar2->val).t = pvVar3->t;
  *(undefined4 *)&(pFVar2->val).field_0x4 = uVar1;
  (pFVar2->val).v = pvVar3->v;
  std::__cxx11::string::clear();
  pFVar2->elementId = 0;
  pAVar4 = decodeUTF8(in_stack_00000378);
  return pAVar4;
}

Assistant:

const AST *builtinDecodeUTF8(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "decodeUTF8", args, {Value::ARRAY});

        Frame &f = stack.top();
        f.kind = FRAME_BUILTIN_DECODE_UTF8;
        f.val = args[0]; // arr
        f.bytes.clear();
        f.elementId = 0;
        return decodeUTF8();
    }